

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O1

Gia_Man_t *
Gia_ManCheckFalse2(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint *__ptr;
  void *pvVar9;
  uint *__ptr_00;
  ulong uVar10;
  void *pvVar11;
  Vec_Wec_t *vHooks;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  undefined8 extraout_RDX_01;
  long lVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint *puVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  Gia_ManLevelNum(p);
  uVar18 = p->vCos->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar17 = 0x10;
  if (0xe < uVar18 - 1) {
    uVar17 = uVar18;
  }
  __ptr[1] = 0;
  *__ptr = uVar17;
  if (uVar17 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)(int)uVar17 << 2);
  }
  puVar25 = __ptr + 2;
  *(void **)(__ptr + 2) = pvVar9;
  pVVar12 = p->vCos;
  uVar22 = (ulong)(uint)pVVar12->nSize;
  if (0 < pVVar12->nSize) {
    lVar15 = 0;
    do {
      iVar7 = pVVar12->pArray[lVar15];
      if ((iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_007332af;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar7 = Gia_ObjLevelId(p,iVar7);
      uVar18 = *__ptr;
      if (__ptr[1] == uVar18) {
        if ((int)uVar18 < 0x10) {
          if (*(void **)puVar25 == (void *)0x0) {
            pvVar9 = malloc(0x40);
          }
          else {
            pvVar9 = realloc(*(void **)puVar25,0x40);
          }
          uVar17 = 0x10;
        }
        else {
          uVar17 = uVar18 * 2;
          if ((int)uVar17 <= (int)uVar18) goto LAB_00732c2a;
          if (*(void **)puVar25 == (void *)0x0) {
            pvVar9 = malloc((ulong)uVar18 << 3);
          }
          else {
            pvVar9 = realloc(*(void **)puVar25,(ulong)uVar18 << 3);
          }
        }
        *(void **)(__ptr + 2) = pvVar9;
        *__ptr = uVar17;
      }
LAB_00732c2a:
      uVar18 = __ptr[1];
      __ptr[1] = uVar18 + 1;
      *(float *)(*(long *)(__ptr + 2) + (long)(int)uVar18 * 4) = (float)iVar7;
      lVar15 = lVar15 + 1;
      pVVar12 = p->vCos;
      uVar22 = (ulong)pVVar12->nSize;
    } while (lVar15 < (long)uVar22);
  }
  __ptr_00 = (uint *)calloc(1,0x20);
  uVar10 = 0x10;
  if (0x10 < (int)uVar22) {
    uVar10 = uVar22 & 0xffffffff;
  }
  __ptr_00[1] = 1;
  *__ptr_00 = (int)uVar10 + 1;
  sVar16 = uVar10 * 4 + 4;
  pvVar9 = malloc(sVar16);
  memset(pvVar9,0xff,sVar16);
  *(void **)(__ptr_00 + 2) = pvVar9;
  pvVar9 = malloc(sVar16);
  memset(pvVar9,0xff,sVar16);
  *(void **)(__ptr_00 + 4) = pvVar9;
  if (*(long *)(__ptr_00 + 6) != 0) {
    __assert_fail("p->pCostsFlt == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
  }
  *(uint **)(__ptr_00 + 6) = puVar25;
  pVVar12 = p->vCos;
  if (0 < pVVar12->nSize) {
    uVar22 = 0;
    do {
      if ((pVVar12->pArray[uVar22] < 0) || (p->nObjs <= pVVar12->pArray[uVar22])) {
LAB_007332af:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar18 = __ptr_00[1];
      uVar17 = *__ptr_00;
      if ((int)uVar17 <= (int)uVar18) {
        uVar23 = uVar18 + 1;
        uVar8 = uVar17 * 2;
        if (uVar23 != uVar8 && SBORROW4(uVar23,uVar8) == (int)(uVar23 + uVar17 * -2) < 0) {
          uVar8 = uVar23;
        }
        if ((int)uVar17 < (int)uVar8) {
          sVar16 = (long)(int)uVar8 << 2;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar9 = malloc(sVar16);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr_00 + 2),sVar16);
          }
          *(void **)(__ptr_00 + 2) = pvVar9;
          if (*(void **)(__ptr_00 + 4) == (void *)0x0) {
            pvVar11 = malloc(sVar16);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr_00 + 4),sVar16);
          }
          *(void **)(__ptr_00 + 4) = pvVar11;
          sVar16 = (long)(int)(uVar8 - uVar17) << 2;
          memset((void *)((long)pvVar9 + (long)(int)uVar17 * 4),0xff,sVar16);
          memset((void *)((long)pvVar11 + (long)(int)uVar17 * 4),0xff,sVar16);
          *__ptr_00 = uVar8;
        }
      }
      uVar17 = *__ptr_00;
      lVar15 = (long)(int)uVar17;
      iVar7 = (int)uVar22;
      if (lVar15 <= (long)uVar22) {
        uVar23 = uVar17 * 2;
        uVar8 = iVar7 + 1;
        if (uVar8 != uVar23 && SBORROW4(uVar8,uVar23) == (int)(uVar8 + uVar17 * -2) < 0) {
          uVar23 = uVar8;
        }
        if ((int)uVar17 < (int)uVar23) {
          sVar16 = (ulong)uVar23 * 4;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar9 = malloc(sVar16);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr_00 + 2),sVar16);
          }
          *(void **)(__ptr_00 + 2) = pvVar9;
          sVar16 = (ulong)uVar23 << 2;
          if (*(void **)(__ptr_00 + 4) == (void *)0x0) {
            pvVar11 = malloc(sVar16);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr_00 + 4),sVar16);
          }
          *(void **)(__ptr_00 + 4) = pvVar11;
          sVar16 = (long)(int)(uVar23 - uVar17) << 2;
          memset((void *)((long)pvVar9 + lVar15 * 4),0xff,sVar16);
          memset((void *)((long)pvVar11 + lVar15 * 4),0xff,sVar16);
          *__ptr_00 = uVar23;
        }
      }
      if ((int)*__ptr_00 <= (int)uVar18) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      lVar15 = *(long *)(__ptr_00 + 4);
      if (*(int *)(lVar15 + uVar22 * 4) != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      lVar3 = *(long *)(__ptr_00 + 2);
      if (*(int *)(lVar3 + (long)(int)uVar18 * 4) != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      *(uint *)(lVar15 + uVar22 * 4) = uVar18;
      __ptr_00[1] = uVar18 + 1;
      *(int *)(lVar3 + (long)(int)uVar18 * 4) = iVar7;
      lVar4 = *(long *)puVar25;
      if (lVar4 == 0) {
        fVar26 = (float)iVar7;
      }
      else {
        fVar26 = *(float *)(lVar4 + uVar22 * 4);
      }
      uVar18 = *(uint *)(lVar15 + uVar22 * 4);
      uVar10 = (ulong)(int)uVar18;
      if (uVar10 == 0xffffffffffffffff) {
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (uVar22 != *(uint *)(lVar3 + uVar10 * 4)) {
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (1 < (int)uVar18) {
        do {
          uVar17 = (uint)uVar10;
          uVar19 = uVar10 >> 1 & 0x7fffffff;
          iVar1 = *(int *)(lVar3 + uVar19 * 4);
          if (lVar4 == 0) {
            fVar27 = (float)iVar1;
          }
          else {
            fVar27 = *(float *)(lVar4 + (long)iVar1 * 4);
          }
          uVar18 = uVar17;
          if (fVar26 <= fVar27) break;
          *(int *)(lVar3 + (uVar10 & 0xffffffff) * 4) = iVar1;
          *(uint *)(lVar15 + (long)iVar1 * 4) = uVar17;
          uVar10 = uVar19;
          uVar18 = (uint)uVar19;
        } while (3 < uVar17);
      }
      *(int *)(lVar3 + (long)(int)uVar18 * 4) = iVar7;
      *(uint *)(lVar15 + uVar22 * 4) = uVar18;
      uVar22 = uVar22 + 1;
      pVVar12 = p->vCos;
    } while ((long)uVar22 < (long)pVVar12->nSize);
  }
  uVar18 = p->nObjs;
  vHooks = (Vec_Wec_t *)malloc(0x10);
  uVar17 = 8;
  if (6 < uVar18 - 1) {
    uVar17 = uVar18;
  }
  vHooks->nSize = 0;
  vHooks->nCap = uVar17;
  if (uVar17 == 0) {
    pVVar12 = (Vec_Int_t *)0x0;
    uVar14 = extraout_RDX;
  }
  else {
    pVVar12 = (Vec_Int_t *)calloc((long)(int)uVar17,0x10);
    uVar14 = extraout_RDX_00;
  }
  vHooks->pArray = pVVar12;
  vHooks->nSize = uVar18;
  uVar23 = __ptr_00[1];
  lVar15 = (long)(int)uVar23;
  if ((long)(int)uVar23 < 1) {
    __ptr_00[1] = uVar23;
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x88,"int Vec_QueSize(Vec_Que_t *)");
  }
  do {
    iVar7 = (int)uVar14;
    fVar26 = -1e+09;
    if (lVar15 != 1) {
      if (*(long *)puVar25 == 0) {
        fVar26 = (float)*(int *)(*(long *)(__ptr_00 + 2) + 4);
      }
      else {
        fVar26 = *(float *)(*(long *)puVar25 + (long)*(int *)(*(long *)(__ptr_00 + 2) + 4) * 4);
      }
    }
    if (fVar26 < (float)(p->nLevels - nSlackMax)) {
      __ptr_00[1] = (uint)lVar15;
      if (fVerbose != 0) {
        if ((int)uVar18 < 1) {
          uVar22 = 0;
        }
        else {
          lVar15 = 0;
          uVar22 = 0;
          do {
            uVar22 = (ulong)((int)uVar22 + (uint)(0 < *(int *)((long)&pVVar12->nSize + lVar15)));
            lVar15 = lVar15 + 0x10;
          } while ((ulong)uVar18 << 4 != lVar15);
        }
        printf("Collected %d non-overlapping false paths.\n",uVar22);
        iVar7 = extraout_EDX;
      }
      pGVar13 = Gia_ManFalseRebuild(p,vHooks,iVar7,fVeryVerbose);
      if (0 < (int)uVar17) {
        lVar15 = 0;
        do {
          pvVar9 = *(void **)((long)&pVVar12->pArray + lVar15);
          if (pvVar9 != (void *)0x0) {
            free(pvVar9);
            *(undefined8 *)((long)&pVVar12->pArray + lVar15) = 0;
          }
          lVar15 = lVar15 + 0x10;
        } while ((ulong)uVar17 << 4 != lVar15);
      }
      if (pVVar12 != (Vec_Int_t *)0x0) {
        free(pVVar12);
        vHooks->pArray = (Vec_Int_t *)0x0;
      }
      vHooks->nCap = 0;
      vHooks->nSize = 0;
      free(vHooks);
      if (*(void **)puVar25 != (void *)0x0) {
        free(*(void **)puVar25);
        puVar25[0] = 0;
        puVar25[1] = 0;
      }
      free(__ptr);
      if (*(void **)(__ptr_00 + 4) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 4));
        __ptr_00[4] = 0;
        __ptr_00[5] = 0;
      }
      if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 2));
        __ptr_00[2] = 0;
        __ptr_00[3] = 0;
      }
      free(__ptr_00);
      return pGVar13;
    }
    if (lVar15 == 1) {
      __ptr_00[1] = 1;
      __assert_fail("p->nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xed,"int Vec_QuePop(Vec_Que_t *)");
    }
    lVar4 = *(long *)(__ptr_00 + 2);
    lVar5 = *(long *)(__ptr_00 + 4);
    iVar7 = *(int *)(lVar4 + 4);
    *(undefined4 *)(lVar5 + (long)iVar7 * 4) = 0xffffffff;
    lVar3 = lVar15 + -1;
    if (lVar3 == 1) {
      *(undefined4 *)(lVar4 + 4) = 0xffffffff;
    }
    else {
      iVar1 = *(int *)(lVar4 + lVar3 * 4);
      *(undefined4 *)(lVar4 + lVar3 * 4) = 0xffffffff;
      *(int *)(lVar4 + 4) = iVar1;
      lVar20 = (long)iVar1;
      *(undefined4 *)(lVar5 + lVar20 * 4) = 1;
      lVar6 = *(long *)puVar25;
      if (lVar6 == 0) {
        fVar26 = (float)iVar1;
      }
      else {
        fVar26 = *(float *)(lVar6 + lVar20 * 4);
      }
      uVar23 = 1;
      if (3 < lVar15) {
        uVar8 = 2;
        uVar23 = 1;
        do {
          uVar24 = uVar8 | 1;
          uVar21 = uVar8;
          if ((int)uVar24 < lVar3) {
            iVar2 = *(int *)(lVar4 + (long)(int)uVar8 * 4);
            if (lVar6 == 0) {
              fVar27 = (float)iVar2;
            }
            else {
              fVar27 = *(float *)(lVar6 + (long)iVar2 * 4);
            }
            iVar2 = *(int *)(lVar4 + (long)(int)uVar24 * 4);
            if (lVar6 == 0) {
              fVar28 = (float)iVar2;
            }
            else {
              fVar28 = *(float *)(lVar6 + (long)iVar2 * 4);
            }
            if (fVar27 < fVar28) {
              uVar21 = uVar24;
            }
          }
          if (lVar3 <= (int)uVar21) {
            __ptr_00[1] = (uint)lVar3;
            __assert_fail("child < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                          ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
          }
          iVar2 = *(int *)(lVar4 + (long)(int)uVar21 * 4);
          if (lVar6 == 0) {
            fVar27 = (float)iVar2;
          }
          else {
            fVar27 = *(float *)(lVar6 + (long)iVar2 * 4);
          }
          if (fVar27 <= fVar26) break;
          *(int *)(lVar4 + (long)(int)uVar23 * 4) = iVar2;
          *(uint *)(lVar5 + (long)iVar2 * 4) = uVar23;
          uVar8 = uVar21 * 2;
          uVar23 = uVar21;
        } while ((int)uVar8 < lVar3);
      }
      *(int *)(lVar4 + (long)(int)uVar23 * 4) = iVar1;
      *(uint *)(lVar5 + lVar20 * 4) = uVar23;
    }
    Gia_ManCheckFalseOne(p,iVar7,nTimeOut,vHooks,fVerbose,fVeryVerbose);
    uVar14 = extraout_RDX_01;
    lVar15 = lVar3;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse2( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew;
    Vec_Wec_t * vHooks;
    Vec_Que_t * vPrio;
    Vec_Flt_t * vWeights;
    Gia_Obj_t * pObj;
    int i;
//    srand( 111 );
    Gia_ManLevelNum( p );
    // create PO weights
    vWeights = Vec_FltAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_FltPush( vWeights, Gia_ObjLevel(p, pObj) );
    // put POs into the queue
    vPrio = Vec_QueAlloc( Gia_ManCoNum(p) );
    Vec_QueSetPriority( vPrio, Vec_FltArrayP(vWeights) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_QuePush( vPrio, i );
    // work on each PO in the queue
    vHooks = Vec_WecStart( Gia_ManObjNum(p) );
    while ( Vec_QueTopPriority(vPrio) >= p->nLevels - nSlackMax )
        Gia_ManCheckFalseOne( p, Vec_QuePop(vPrio), nTimeOut, vHooks, fVerbose, fVeryVerbose );
    if ( fVerbose )
    printf( "Collected %d non-overlapping false paths.\n", Vec_WecSizeUsed(vHooks) );
    // reconstruct the AIG
    pNew = Gia_ManFalseRebuild( p, vHooks, fVerbose, fVeryVerbose );
    // cleanup
    Vec_WecFree( vHooks );
    Vec_FltFree( vWeights );
    Vec_QueFree( vPrio );
    return pNew;
}